

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<long_double,_10>::TPZManVector
          (TPZManVector<long_double,_10> *this,TPZVec<long_double> *copy)

{
  longdouble *plVar1;
  longdouble *plVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  (this->super_TPZVec<long_double>).fStore = (longdouble *)0x0;
  (this->super_TPZVec<long_double>).fNElements = 0;
  (this->super_TPZVec<long_double>).fNAlloc = 0;
  (this->super_TPZVec<long_double>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01841d20;
  uVar5 = copy->fNElements;
  if ((long)uVar5 < 0xb) {
    plVar2 = this->fExtAlloc;
    uVar3 = 0;
  }
  else {
    plVar2 = (longdouble *)operator_new__(-(ulong)(uVar5 >> 0x3c != 0) | uVar5 << 4);
    uVar3 = uVar5;
  }
  (this->super_TPZVec<long_double>).fStore = plVar2;
  (this->super_TPZVec<long_double>).fNElements = uVar5;
  (this->super_TPZVec<long_double>).fNAlloc = uVar3;
  if (0 < (long)uVar5) {
    plVar2 = copy->fStore;
    plVar1 = (this->super_TPZVec<long_double>).fStore;
    lVar4 = 0;
    do {
      *(unkbyte10 *)((long)plVar1 + lVar4) = *(unkbyte10 *)((long)plVar2 + lVar4);
      lVar4 = lVar4 + 0x10;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(
        const TPZVec<T> & copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= (int64_t) (sizeof (fExtAlloc) / sizeof (T))) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy[i];
    }
}